

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::moveAppend
          (QGenericArrayOps<QMessagePattern::BacktraceParams> *this,BacktraceParams *b,
          BacktraceParams *e)

{
  qsizetype *pqVar1;
  BacktraceParams *pBVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
      pDVar4 = (b->backtraceSeparator).d.d;
      (b->backtraceSeparator).d.d = (Data *)0x0;
      pBVar2[lVar3].backtraceSeparator.d.d = pDVar4;
      pcVar5 = (b->backtraceSeparator).d.ptr;
      (b->backtraceSeparator).d.ptr = (char16_t *)0x0;
      pBVar2[lVar3].backtraceSeparator.d.ptr = pcVar5;
      qVar6 = (b->backtraceSeparator).d.size;
      (b->backtraceSeparator).d.size = 0;
      pBVar2[lVar3].backtraceSeparator.d.size = qVar6;
      pBVar2[lVar3].backtraceDepth = b->backtraceDepth;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMessagePattern::BacktraceParams>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }